

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.h
# Opt level: O2

uchar __thiscall Bstrlib::CBString::character(CBString *this,int i)

{
  CBStringException *this_00;
  allocator local_59;
  string local_58;
  CBStringException bstr__cppwrapper_exception;
  
  if ((uint)i < (uint)(this->super_tagbstring).slen) {
    return (this->super_tagbstring).data[i];
  }
  std::__cxx11::string::string
            ((string *)&local_58,"CBString::character idx out of bounds",&local_59);
  CBStringException::CBStringException(&bstr__cppwrapper_exception,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&bstr__cppwrapper_exception);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

inline unsigned char character (int i) const {
		if (((unsigned) i) >= (unsigned) slen) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
			bstringThrow ("character idx out of bounds");
#else
			return '\0';
#endif
		}
		return data[i];
	}